

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::~ConsoleReporter(ConsoleReporter *this)

{
  GroupInfo *pGVar1;
  pointer pcVar2;
  TestRunInfo *pTVar3;
  IConfig *pIVar4;
  
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__ConsoleReporter_00166e60;
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&(this->super_StreamingReporterBase).m_sectionStack);
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  pGVar1 = (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           nullableValue;
  if ((pGVar1 != (GroupInfo *)0x0) &&
     (pcVar2 = (pGVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pGVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.nullableValue
       = (GroupInfo *)0x0;
  pTVar3 = (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
           nullableValue;
  if ((pTVar3 != (TestRunInfo *)0x0) &&
     (pcVar2 = (pTVar3->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pTVar3->name).field_2)) {
    operator_delete(pcVar2);
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
  nullableValue = (TestRunInfo *)0x0;
  pIVar4 = (this->super_StreamingReporterBase).m_config.m_p;
  if (pIVar4 != (IConfig *)0x0) {
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}